

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basestat.cpp
# Opt level: O2

void __thiscall MetaSim::BaseStat::print(BaseStat *this)

{
  ostream *poVar1;
  double dVar2;
  string asStack_38 [32];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"[");
  std::__cxx11::string::string(asStack_38,(string *)&this->_name);
  poVar1 = std::operator<<(poVar1,asStack_38);
  std::operator<<(poVar1,"]:");
  dVar2 = getMean(this);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar1,"  (Conf[95%]=");
  dVar2 = getConfInterval(this,C95);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

void BaseStat::print()
    {
        cout << "[" << getName()
             << "]:" << getMean()
             << "  (Conf[95%]=" << getConfInterval(BaseStat::C95)
             << ")" 
             << endl;
    }